

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<kj::File,_std::nullptr_t> __thiscall kj::newDiskFile(kj *this,OwnFd *fd)

{
  OwnFd *params;
  File *extraout_RDX;
  Own<kj::File,_std::nullptr_t> OVar1;
  Own<kj::(anonymous_namespace)::DiskFile,_std::nullptr_t> local_28;
  OwnFd *local_18;
  OwnFd *fd_local;
  
  local_18 = fd;
  fd_local = (OwnFd *)this;
  params = mv<kj::OwnFd>(fd);
  heap<kj::(anonymous_namespace)::DiskFile,kj::OwnFd>((kj *)&local_28,params);
  Own<kj::File,decltype(nullptr)>::Own<kj::(anonymous_namespace)::DiskFile,void>
            ((Own<kj::File,decltype(nullptr)> *)this,&local_28);
  Own<kj::(anonymous_namespace)::DiskFile,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<File> newDiskFile(kj::OwnFd fd) {
  return heap<DiskFile>(kj::mv(fd));
}